

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O3

void __thiscall
level_mesh::push(level_mesh *this,uint16_t sector,xr_vbuf *vb,xr_ibuf *ib,uint16_t texture,
                uint16_t eshader,fmatrix *xform)

{
  anon_union_48_3_fb61167d_for_b_face_0 local_48;
  uint16_t local_18;
  uint16_t local_16;
  ulong local_14;
  uint16_t local_a;
  
  local_48.field_0.v[0] = 0xffffffff;
  local_48.field_0.v[1] = 0xffffffff;
  local_48.field_0.v[2] = 0xffffffff;
  local_48.field_0.n[0] = 0xffffffff;
  local_48.field_0.n[1] = 0xffffffff;
  local_48.field_0.n[2] = 0xffffffff;
  local_48.field_0.tc[0] = 0xffffffff;
  local_48.field_0.tc[1] = 0xffffffff;
  local_48.field_0.tc[2] = 0xffffffff;
  local_48.field_0.link[0] = 0xffffffff;
  local_48.field_0.link[1] = 0xffffffff;
  local_48.field_0.link[2] = 0xffffffff;
  local_14 = CONCAT44(0xffffffff,CONCAT22((short)((vb->m_signature & 8) >> 1),0xffff)) | 0x20000;
  local_18 = texture;
  local_16 = eshader;
  local_a = sector;
  xray_re::xr_mesh_builder::__push
            (&this->super_xr_mesh_builder,vb,ib,xform,(b_face *)&local_48.field_0,0);
  return;
}

Assistant:

void level_mesh::push(uint16_t sector, const xr_vbuf& vb, const xr_ibuf& ib,
	uint16_t texture, uint16_t eshader, const fmatrix& xform)
{
	b_face face_template(sector);
	face_template.surface.set(texture, eshader);
	if (vb.has_lightmaps())
		face_template.surface.flags |= RSF_LIGHTMAP;
	xr_mesh_builder::__push(vb, ib, &xform, face_template);
}